

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ThreadSafeArena::ThreadSafeArena(ThreadSafeArena *this)

{
  long lVar1;
  uint64_t uVar2;
  long *in_FS_OFFSET;
  
  (this->first_arena_).cleanup_list_.prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).string_block_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).cleanup_list_.next_ = (CleanupNode *)0x0;
  (this->first_arena_).cleanup_list_.limit_ = (CleanupNode *)0x0;
  (this->first_arena_).prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).cleanup_list_.head_ = (Chunk *)0x0;
  (this->first_arena_).ptr_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).limit_ = (char *)0x0;
  (this->first_arena_).string_block_unused_.super___atomic_base<unsigned_long>._M_i = 0;
  (this->alloc_policy_).policy_ = 0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this->first_arena_).head_._M_b._M_p = (__pointer_type)(anonymous_namespace)::kSentryArenaBlock;
  (this->first_arena_).space_used_.super___atomic_base<unsigned_long>._M_i = 0;
  (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i = 0;
  (this->first_arena_).parent_ = this;
  (this->first_arena_).cached_block_length_ = '\0';
  (this->first_arena_).cached_blocks_ = (CachedBlock **)0x0;
  lVar1 = *in_FS_OFFSET;
  uVar2 = in_FS_OFFSET[-0x10];
  if ((char)uVar2 == '\0') {
    LOCK();
    UNLOCK();
    uVar2 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  in_FS_OFFSET[-0x10] = uVar2 + 1;
  this->tag_and_id_ = uVar2;
  (this->head_)._M_b._M_p = (__pointer_type)kSentryArenaChunk;
  this->first_owner_ = (void *)(lVar1 + -0x80);
  in_FS_OFFSET[-0xe] = (long)&this->first_arena_;
  in_FS_OFFSET[-0xf] = uVar2;
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena() : first_arena_(*this) { Init(); }